

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpath_parser.hpp
# Opt level: O2

path_expression_type * __thiscall
jsoncons::jsonpath::detail::
jsonpath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
::compile(path_expression_type *__return_storage_ptr__,
         jsonpath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
         *this,static_resources<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
               *resources,string_view_type *path)

{
  jsonpath_error *this_00;
  error_code ec_00;
  error_code ec;
  
  ec._M_value = 0;
  ec._M_cat = (error_category *)std::_V2::system_category();
  compile(__return_storage_ptr__,this,resources,path,&ec);
  if (ec._M_value == 0) {
    return __return_storage_ptr__;
  }
  this_00 = (jsonpath_error *)__cxa_allocate_exception(0x58);
  ec_00._4_4_ = 0;
  ec_00._M_value = ec._M_value;
  ec_00._M_cat = ec._M_cat;
  jsonpath_error::jsonpath_error(this_00,ec_00,this->line_,this->column_);
  __cxa_throw(this_00,&jsonpath_error::typeinfo,jsonpath_error::~jsonpath_error);
}

Assistant:

path_expression_type compile(static_resources<value_type>& resources, const string_view_type& path)
        {
            std::error_code ec;
            auto result = compile(resources, path, ec);
            if (JSONCONS_UNLIKELY(ec))
            {
                JSONCONS_THROW(jsonpath_error(ec, line_, column_));
            }
            return result;
        }